

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Value * __thiscall GlobOpt::ValueNumberLdElemDst(GlobOpt *this,Instr **pInstr,Value *srcVal)

{
  Opnd *this_00;
  IndirOpnd *indirOpnd;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  bool bVar4;
  bool bVar5;
  ObjectType OVar6;
  uint uVar7;
  uint uVar8;
  int32 newMax;
  BailOutKind BVar9;
  BailOutKind BVar10;
  undefined4 *puVar11;
  JITTimeFunctionBody *pJVar12;
  FunctionJITTimeInfo *pFVar13;
  char16 *pcVar14;
  char16 *pcVar15;
  char16 *pcVar16;
  Value *pVVar17;
  Instr *pIVar18;
  char16_t *pcVar19;
  int32 newMin;
  ValueInfo *pVVar20;
  BailOutKind bailOutKind;
  wchar local_2b8 [4];
  char16 debugStringBuffer [42];
  wchar local_1b8 [4];
  char16 debugStringBuffer_1 [42];
  char local_158 [8];
  char baseValueTypeStr [256];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [3];
  ValueType profiledElementType;
  ValueType baseValueType;
  
  this_00 = (*pInstr)->m_dst;
  baseValueTypeStr[0xf8] = '\0';
  baseValueTypeStr[0xf9] = '\0';
  baseValueTypeStr[0xfa] = '\0';
  baseValueTypeStr[0xfb] = '\0';
  baseValueTypeStr[0xfc] = '\0';
  baseValueTypeStr[0xfd] = '\0';
  baseValueTypeStr[0xfe] = '\0';
  baseValueTypeStr[0xff] = '\0';
  if (srcVal == (Value *)0x0) {
    pVVar20 = (ValueInfo *)0x0;
  }
  else {
    pVVar20 = srcVal->valueInfo;
  }
  ValueType::ValueType((ValueType *)&local_34.field_0);
  if ((*pInstr)->m_kind == InstrKindProfiled) {
    local_34 = (anon_union_2_4_ea848c7b_for_ValueType_13)
               *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                &((anon_union_2_4_ea848c7b_for_ValueType_13 *)((long)(*pInstr)[1]._vptr_Instr + 2))
                 ->field_0;
    bVar2 = ValueType::IsLikelyInt((ValueType *)&local_34.field_0);
    if ((bVar2) && (OVar3 = IR::Opnd::GetKind(this_00), OVar3 == OpndKindReg)) {
      OVar3 = IR::Opnd::GetKind(this_00);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar2) goto LAB_004549b9;
        *puVar11 = 0;
      }
      if ((srcVal != (Value *)0x0) && (((ulong)this_00[1]._vptr_Opnd[3] & 2) == 0)) {
LAB_00453e86:
        bVar2 = ValueType::IsUninitialized(&pVVar20->super_ValueType);
        if (bVar2) {
          if (this->prePassLoop == (Loop *)0x0) {
            (pVVar20->super_ValueType).field_0.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_34;
            IR::Opnd::SetValueType((*pInstr)->m_src1,(ValueType)local_34.field_0);
          }
          else {
            baseValueTypeStr._248_8_ = NewGenericValue(this,(ValueType)local_34.field_0,this_00);
          }
        }
      }
    }
    else if (srcVal != (Value *)0x0) goto LAB_00453e86;
  }
  indirOpnd = (IndirOpnd *)(*pInstr)->m_src1;
  OVar3 = IR::Opnd::GetKind((Opnd *)indirOpnd);
  if (OVar3 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar2) goto LAB_004549b9;
    *puVar11 = 0;
  }
  local_32[0] = (indirOpnd->m_baseOpnd->super_Opnd).m_valueType.field_0;
  bVar2 = IR::Instr::DoStackArgsOpt(*pInstr);
  if ((((bVar2) ||
       ((bVar2 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_32[0].field_0), !bVar2
        && ((bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0), !bVar2 ||
            ((*pInstr)->m_kind != InstrKindProfiled)))))) ||
      ((bVar2 = DoTypedArrayTypeSpec(this->func), !bVar2 &&
       (bVar2 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_32[0].field_0), bVar2))))
     || (((bVar2 = DoNativeArrayTypeSpec(this->func), !bVar2 &&
          (bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0), bVar2)) ||
         (bVar2 = ShouldExpectConventionalArrayIndexValue(this,indirOpnd), !bVar2)))) {
    bVar2 = DoTypedArrayTypeSpec(this->func);
    if ((bVar2) && (this->prePassLoop == (Loop *)0x0)) {
      pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
      pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,uVar7,uVar8);
      if (bVar2) {
        Output::Print(L"TRACE ");
        if (this->prePassLoop != (Loop *)0x0) {
          Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                        (ulong)(this->prePassLoop->loopNumber - 1));
        }
        Output::Print(L": ");
        Output::Print(L"Didn\'t specialize array access.\n");
        IR::Instr::Dump(*pInstr);
        Output::Flush();
      }
      pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
      pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,TypedArrayTypeSpecPhase,uVar7,uVar8);
      if (bVar2) {
        ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_158);
        pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
        pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar13,(wchar (*) [42])local_2b8);
        pcVar16 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
        bVar2 = IR::Instr::DoStackArgsOpt(*pInstr);
        if (bVar2) {
          pcVar19 = L"instruction uses the arguments object";
        }
        else {
          bVar2 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_32[0].field_0);
          pcVar19 = L"of array type";
          if (bVar2) {
            pcVar19 = L"index is negative or likely not int";
          }
        }
        Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not type specialize, because %s.\n"
                      ,pcVar14,pcVar15,pcVar16,local_158,pcVar19);
        Output::Flush();
      }
    }
    goto LAB_004543e2;
  }
  OVar3 = IR::Opnd::GetKind((*pInstr)->m_src1);
  if (OVar3 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1521,"(instr->GetSrc1()->IsIndirOpnd())","instr->GetSrc1()->IsIndirOpnd()"
                      );
    if (!bVar2) goto LAB_004549b9;
    *puVar11 = 0;
  }
  OVar6 = ValueType::GetObjectType((ValueType *)&local_32[0].field_0);
  bailOutKind = BailOutConventionalTypedArrayAccessOnly;
  switch(OVar6) {
  case Int8Array:
  case Int8VirtualArray:
  case Int8MixedArray:
    newMin = -0x80;
    newMax = 0x7f;
    break;
  case Uint8Array:
  case Uint8ClampedArray:
  case Uint8VirtualArray:
  case Uint8ClampedVirtualArray:
  case Uint8MixedArray:
  case Uint8ClampedMixedArray:
    newMin = 0;
    newMax = 0xff;
    break;
  case Int16Array:
  case Int16VirtualArray:
  case Int16MixedArray:
    newMin = -0x8000;
    newMax = 0x7fff;
    break;
  case Uint16Array:
  case Uint16VirtualArray:
  case Uint16MixedArray:
    newMin = 0;
    newMax = 0xffff;
    break;
  case Int32Array:
  case Uint32Array:
  case Int32VirtualArray:
  case Uint32VirtualArray:
  case Int32MixedArray:
  case Uint32MixedArray:
    newMin = -0x80000000;
    newMax = 0x7fffffff;
    break;
  case Float32Array:
  case Float64Array:
  case Float32VirtualArray:
  case Float64VirtualArray:
  case Float32MixedArray:
  case Float64MixedArray:
    bVar5 = true;
    bVar2 = false;
LAB_00454276:
    OVar3 = IR::Opnd::GetKind(this_00);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1592,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
      if (!bVar4) goto LAB_004549b9;
      *puVar11 = 0;
    }
    if ((this->field_0xf5 & 0x20) != 0) {
      if (this->prePassLoop == (Loop *)0x0) {
        if (((*pInstr)->field_0x38 & 0x10) == 0) {
          GenerateBailAtOperation(this,pInstr,bailOutKind);
        }
        else {
          BVar9 = IR::Instr::GetBailOutKind(*pInstr);
          if ((((BVar9 & ~BailOutKindBits) != BailOutOnImplicitCallsPreOp) &&
              ((BVar9 & ~BailOutKindBits) != BailOutInvalid)) ||
             ((BVar9 & (LazyBailOut|BailOutOnDivSrcConditions|BailOutForDebuggerBits|
                        BailOnStackArgsOutOfActualsRange|BailOutOnInvalidatedArrayLength|
                        BailOutOnInvalidatedArrayHeadSegment|BailOutConvertedNativeArray|
                        BailOutConventionalNativeArrayAccessOnly|BailOutOnMissingValue|
                       BailOutOnResultConditions)) != BailOutInvalid)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar11 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x15af,
                               "(( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)))"
                               ,
                               "( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject))"
                              );
            if (!bVar4) goto LAB_004549b9;
            *puVar11 = 0;
          }
          if (bVar5) {
            pIVar18 = *pInstr;
            BVar9 = BVar9 & (BailOutMisc|BailOutOnDivSrcConditions|BailOutForDebuggerBits|
                             BailOnStackArgsOutOfActualsRange|BailOutOnInvalidatedArrayLength|
                             BailOutOnInvalidatedArrayHeadSegment|BailOutConvertedNativeArray|
                             BailOutConventionalNativeArrayAccessOnly|BailOutOnMissingValue|
                            BailOutOnResultConditions) | BailOutConventionalTypedArrayAccessOnly;
          }
          else {
            BVar10 = BailOutConventionalNativeArrayAccessOnly;
            if (!bVar2) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar11 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x15bc,
                                 "(bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly)",
                                 "bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly");
              if (!bVar2) goto LAB_004549b9;
              *puVar11 = 0;
              BVar10 = bailOutKind;
            }
            BVar9 = BVar9 | BVar10;
            pIVar18 = *pInstr;
          }
          IR::Instr::SetBailOutKind(pIVar18,BVar9);
        }
      }
      TypeSpecializeFloatDst
                (this,*pInstr,(Value *)0x0,(Value *)0x0,(Value *)0x0,
                 (Value **)(baseValueTypeStr + 0xf8));
      pcVar19 = L"float64";
      goto LAB_00454606;
    }
    goto LAB_004543e2;
  default:
    bVar2 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x15ca,"(baseValueType.IsLikelyNativeArray())",
                         "baseValueType.IsLikelyNativeArray()");
      if (!bVar2) goto LAB_004549b9;
      *puVar11 = 0;
    }
    bVar2 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
    if (!bVar2) {
      bVar5 = ValueType::HasFloatElements((ValueType *)&local_32[0].field_0);
      bailOutKind = BailOutConventionalNativeArrayAccessOnly;
      bVar2 = true;
      if (bVar5) {
        bVar5 = false;
        bVar2 = true;
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x15d0,"(baseValueType.HasFloatElements())",
                           "baseValueType.HasFloatElements()");
        if (!bVar5) goto LAB_004549b9;
        *puVar11 = 0;
        bVar5 = false;
        bailOutKind = BailOutConventionalNativeArrayAccessOnly;
      }
      goto LAB_00454276;
    }
    newMin = -0x80000000;
    newMax = 0x7fffffff;
    bailOutKind = BailOutConventionalNativeArrayAccessOnly;
  }
  OVar3 = IR::Opnd::GetKind(this_00);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1553,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
    if (!bVar2) goto LAB_004549b9;
    *puVar11 = 0;
  }
  if ((this->field_0xf5 & 0x22) == 0) {
LAB_004543e2:
    pVVar17 = (Value *)baseValueTypeStr._248_8_;
    if (baseValueTypeStr._248_8_ == 0) {
      if (srcVal == (Value *)0x0) {
        pVVar17 = NewGenericValue(this,(ValueType)local_34.field_0,this_00);
      }
      else {
        pVVar17 = srcVal;
        if (this->prePassLoop != (Loop *)0x0) {
          pVVar17 = ValueNumberTransferDstInPrepass(this,*pInstr,srcVal);
        }
      }
    }
    return pVVar17;
  }
  if (this->prePassLoop == (Loop *)0x0) {
    if (((*pInstr)->field_0x38 & 0x10) == 0) {
      GenerateBailAtOperation(this,pInstr,bailOutKind);
    }
    else {
      BVar9 = IR::Instr::GetBailOutKind(*pInstr);
      if ((((BVar9 & ~BailOutKindBits) != BailOutOnImplicitCallsPreOp) &&
          ((BVar9 & ~BailOutKindBits) != BailOutInvalid)) ||
         ((BVar9 & (LazyBailOut|BailOutOnDivSrcConditions|BailOutForDebuggerBits|
                    BailOnStackArgsOutOfActualsRange|BailOutOnInvalidatedArrayLength|
                    BailOutOnInvalidatedArrayHeadSegment|BailOutConvertedNativeArray|
                    BailOutConventionalNativeArrayAccessOnly|BailOutOnMissingValue|
                   BailOutOnResultConditions)) != BailOutInvalid)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1571,
                           "(( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)))"
                           ,
                           "( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject))"
                          );
        if (!bVar2) goto LAB_004549b9;
        *puVar11 = 0;
      }
      if (bailOutKind == BailOutConventionalNativeArrayAccessOnly) {
LAB_004545c4:
        BVar9 = BVar9 | bailOutKind;
        pIVar18 = *pInstr;
      }
      else {
        if (bailOutKind != BailOutConventionalTypedArrayAccessOnly) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x157e,"(bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly)"
                             ,"bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly");
          if (!bVar2) {
LAB_004549b9:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar11 = 0;
          goto LAB_004545c4;
        }
        pIVar18 = *pInstr;
        BVar9 = BVar9 & (BailOutMisc|BailOutOnDivSrcConditions|BailOutForDebuggerBits|
                         BailOnStackArgsOutOfActualsRange|BailOutOnInvalidatedArrayLength|
                         BailOutOnInvalidatedArrayHeadSegment|BailOutConvertedNativeArray|
                         BailOutConventionalNativeArrayAccessOnly|BailOutOnMissingValue|
                        BailOutOnResultConditions) | BailOutConventionalTypedArrayAccessOnly;
      }
      IR::Instr::SetBailOutKind(pIVar18,BVar9);
    }
  }
  TypeSpecializeIntDst
            (this,*pInstr,(*pInstr)->m_opcode,(Value *)0x0,(Value *)0x0,(Value *)0x0,bailOutKind,
             newMin,newMax,(Value **)(baseValueTypeStr + 0xf8),(AddSubConstantInfo *)0x0);
  pcVar19 = L"int32";
LAB_00454606:
  pVVar17 = (Value *)baseValueTypeStr._248_8_;
  if (baseValueTypeStr._248_8_ == 0) {
    pVVar17 = NewGenericValue(this,(ValueType)local_34.field_0,this_00);
  }
  pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
  pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,uVar7,uVar8);
  if (bVar2) {
    Output::Print(L"TRACE ");
    if (this->prePassLoop != (Loop *)0x0) {
      Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    Output::Print(L"Type specialized array access.\n");
    IR::Instr::Dump(*pInstr);
    Output::Flush();
  }
  pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
  pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,TypedArrayTypeSpecPhase,uVar7,uVar8);
  if (!bVar2) {
    return pVVar17;
  }
  ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_158);
  ValueType::ToString(&pVVar17->valueInfo->super_ValueType,(char (*) [256])local_2b8);
  pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
  pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar13,(wchar (*) [42])local_1b8);
  pcVar16 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
  Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, type specialized to %s producing %S"
                ,pcVar14,pcVar15,pcVar16,local_158,pcVar19,(char (*) [256])local_2b8);
  Output::Print(L" (");
  ::Value::Dump(pVVar17);
  Output::Print(L").\n");
  Output::Flush();
  return pVVar17;
}

Assistant:

Value *
GlobOpt::ValueNumberLdElemDst(IR::Instr **pInstr, Value *srcVal)
{
    IR::Instr *&instr = *pInstr;
    IR::Opnd *dst = instr->GetDst();
    Value *dstVal = nullptr;
    int32 newMin, newMax;
    ValueInfo *srcValueInfo = (srcVal ? srcVal->GetValueInfo() : nullptr);

    ValueType profiledElementType;
    if (instr->IsProfiledInstr())
    {
        profiledElementType = instr->AsProfiledInstr()->u.ldElemInfo->GetElementType();
        if(!(profiledElementType.IsLikelyInt() && dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->m_isNotNumber) &&
            srcVal &&
            srcValueInfo->IsUninitialized())
        {
            if(IsLoopPrePass())
            {
                dstVal = NewGenericValue(profiledElementType, dst);
            }
            else
            {
                // Assuming the profile data gives more precise value types based on the path it took at runtime, we
                // can improve the original value type.
                srcValueInfo->Type() = profiledElementType;
                instr->GetSrc1()->SetValueType(profiledElementType);
            }
        }
    }
    
    IR::IndirOpnd *src = instr->GetSrc1()->AsIndirOpnd();
    const ValueType baseValueType(src->GetBaseOpnd()->GetValueType());
    if (instr->DoStackArgsOpt() ||
        !(
            baseValueType.IsLikelyOptimizedTypedArray() ||
            (baseValueType.IsLikelyNativeArray() && instr->IsProfiledInstr()) // Specialized native array lowering for LdElem requires that it is profiled.
        ) ||
        (!this->DoTypedArrayTypeSpec() && baseValueType.IsLikelyOptimizedTypedArray()) ||

        // Don't do type spec on native array with a history of accessing gaps, as this is a bailout
        (!this->DoNativeArrayTypeSpec() && baseValueType.IsLikelyNativeArray()) ||
        !ShouldExpectConventionalArrayIndexValue(src))
    {
        if(DoTypedArrayTypeSpec() && !IsLoopPrePass())
        {
            GOPT_TRACE_INSTR(instr, _u("Didn't specialize array access.\n"));
            if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                baseValueType.ToString(baseValueTypeStr);
                Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not type specialize, because %s.\n"),
                    this->func->GetJITFunctionBody()->GetDisplayName(),
                    this->func->GetDebugNumberSet(debugStringBuffer),
                    Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                    baseValueTypeStr,
                    instr->DoStackArgsOpt() ? _u("instruction uses the arguments object") :
                    baseValueType.IsLikelyOptimizedTypedArray() ? _u("index is negative or likely not int") : _u("of array type"));
                Output::Flush();
            }
        }

        if(!dstVal)
        {
            if(srcVal)
            {
                dstVal = this->ValueNumberTransferDst(instr, srcVal);
            }
            else
            {
                dstVal = NewGenericValue(profiledElementType, dst);
            }
        }
        return dstVal;
    }

    Assert(instr->GetSrc1()->IsIndirOpnd());

    IRType toType = TyVar;
    IR::BailOutKind bailOutKind = IR::BailOutConventionalTypedArrayAccessOnly;

    switch(baseValueType.GetObjectType())
    {
    case ObjectType::Int8Array:
    case ObjectType::Int8VirtualArray:
    case ObjectType::Int8MixedArray:
        newMin = Int8ConstMin;
        newMax = Int8ConstMax;
        goto IntArrayCommon;

    case ObjectType::Uint8Array:
    case ObjectType::Uint8VirtualArray:
    case ObjectType::Uint8MixedArray:
    case ObjectType::Uint8ClampedArray:
    case ObjectType::Uint8ClampedVirtualArray:
    case ObjectType::Uint8ClampedMixedArray:
        newMin = Uint8ConstMin;
        newMax = Uint8ConstMax;
        goto IntArrayCommon;

    case ObjectType::Int16Array:
    case ObjectType::Int16VirtualArray:
    case ObjectType::Int16MixedArray:
        newMin = Int16ConstMin;
        newMax = Int16ConstMax;
        goto IntArrayCommon;

    case ObjectType::Uint16Array:
    case ObjectType::Uint16VirtualArray:
    case ObjectType::Uint16MixedArray:
        newMin = Uint16ConstMin;
        newMax = Uint16ConstMax;
        goto IntArrayCommon;

    case ObjectType::Int32Array:
    case ObjectType::Int32VirtualArray:
    case ObjectType::Int32MixedArray:
    case ObjectType::Uint32Array: // int-specialized loads from uint32 arrays will bail out on values that don't fit in an int32
    case ObjectType::Uint32VirtualArray:
    case ObjectType::Uint32MixedArray:
    Int32Array:
        newMin = Int32ConstMin;
        newMax = Int32ConstMax;
        goto IntArrayCommon;

    IntArrayCommon:
        Assert(dst->IsRegOpnd());

        // If int type spec is disabled, it is ok to load int values as they can help float type spec, and merging int32 with float64 => float64.
        // But if float type spec is also disabled, we'll have problems because float64 merged with var => float64...
        if (!this->DoAggressiveIntTypeSpec() && !this->DoFloatTypeSpec())
        {
            if (!dstVal)
            {
                if (srcVal)
                {
                    dstVal = this->ValueNumberTransferDst(instr, srcVal);
                }
                else
                {
                    dstVal = NewGenericValue(profiledElementType, dst);
                }
            }
            return dstVal;
        }

        if (!this->IsLoopPrePass())
        {
            if (instr->HasBailOutInfo())
            {
                const IR::BailOutKind oldBailOutKind = instr->GetBailOutKind();
                Assert(
                    (
                        !(oldBailOutKind & ~IR::BailOutKindBits) ||
                        (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp
                        ) &&
                    !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)));
                if (bailOutKind == IR::BailOutConventionalTypedArrayAccessOnly)
                {
                    // BailOutConventionalTypedArrayAccessOnly also bails out if the array access is outside the head
                    // segment bounds, and guarantees no implicit calls. Override the bailout kind so that the instruction
                    // bails out for the right reason.
                    instr->SetBailOutKind(
                        bailOutKind | (oldBailOutKind & (IR::BailOutKindBits - IR::BailOutOnArrayAccessHelperCall)));
                }
                else
                {
                    // BailOutConventionalNativeArrayAccessOnly by itself may generate a helper call, and may cause implicit
                    // calls to occur, so it must be merged in to eliminate generating the helper call
                    Assert(bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly);
                    instr->SetBailOutKind(oldBailOutKind | bailOutKind);
                }
            }
            else
            {
                GenerateBailAtOperation(&instr, bailOutKind);
            }
        }
        TypeSpecializeIntDst(instr, instr->m_opcode, nullptr, nullptr, nullptr, bailOutKind, newMin, newMax, &dstVal);
        toType = TyInt32;
        break;

    case ObjectType::Float32Array:
    case ObjectType::Float32VirtualArray:
    case ObjectType::Float32MixedArray:
    case ObjectType::Float64Array:
    case ObjectType::Float64VirtualArray:
    case ObjectType::Float64MixedArray:
    Float64Array:
        Assert(dst->IsRegOpnd());

        // If float type spec is disabled, don't load float64 values
        if (!this->DoFloatTypeSpec())
        {
            if (!dstVal)
            {
                if (srcVal)
                {
                    dstVal = this->ValueNumberTransferDst(instr, srcVal);
                }
                else
                {
                    dstVal = NewGenericValue(profiledElementType, dst);
                }
            }
            return dstVal;
        }

        if (!this->IsLoopPrePass())
        {
            if (instr->HasBailOutInfo())
            {
                const IR::BailOutKind oldBailOutKind = instr->GetBailOutKind();
                Assert(
                    (
                        !(oldBailOutKind & ~IR::BailOutKindBits) ||
                        (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp
                        ) &&
                    !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)));
                if (bailOutKind == IR::BailOutConventionalTypedArrayAccessOnly)
                {
                    // BailOutConventionalTypedArrayAccessOnly also bails out if the array access is outside the head
                    // segment bounds, and guarantees no implicit calls. Override the bailout kind so that the instruction
                    // bails out for the right reason.
                    instr->SetBailOutKind(
                        bailOutKind | (oldBailOutKind & (IR::BailOutKindBits - IR::BailOutOnArrayAccessHelperCall)));
                }
                else
                {
                    // BailOutConventionalNativeArrayAccessOnly by itself may generate a helper call, and may cause implicit
                    // calls to occur, so it must be merged in to eliminate generating the helper call
                    Assert(bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly);
                    instr->SetBailOutKind(oldBailOutKind | bailOutKind);
                }
            }
            else
            {
                GenerateBailAtOperation(&instr, bailOutKind);
            }
        }
        TypeSpecializeFloatDst(instr, nullptr, nullptr, nullptr, &dstVal);
        toType = TyFloat64;
        break;

    default:
        Assert(baseValueType.IsLikelyNativeArray());
        bailOutKind = IR::BailOutConventionalNativeArrayAccessOnly;
        if(baseValueType.HasIntElements())
        {
            goto Int32Array;
        }
        Assert(baseValueType.HasFloatElements());
        goto Float64Array;
    }

    if(!dstVal)
    {
        dstVal = NewGenericValue(profiledElementType, dst);
    }

    Assert(toType != TyVar);

    GOPT_TRACE_INSTR(instr, _u("Type specialized array access.\n"));
    if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
        baseValueType.ToString(baseValueTypeStr);
        char dstValTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
        dstVal->GetValueInfo()->Type().ToString(dstValTypeStr);
        Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, type specialized to %s producing %S"),
            this->func->GetJITFunctionBody()->GetDisplayName(),
            this->func->GetDebugNumberSet(debugStringBuffer),
            Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
            baseValueTypeStr,
            toType == TyInt32 ? _u("int32") : _u("float64"),
            dstValTypeStr);
#if DBG_DUMP
        Output::Print(_u(" ("));
        dstVal->Dump();
        Output::Print(_u(").\n"));
#else
        Output::Print(_u(".\n"));
#endif
        Output::Flush();
    }

    return dstVal;
}